

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cc
# Opt level: O2

void predict_or_learn_multi<false,true>(nn *n,single_learner *base,example *ec)

{
  uchar **ppuVar1;
  polylabel *ppVar2;
  features *pfVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  shared_data *psVar7;
  _func_void_shared_data_ptr_float *p_Var8;
  loss_function *plVar9;
  bool *pbVar10;
  polyprediction *pred;
  shared_data *psVar11;
  uint64_t uVar12;
  _func_void_int_string_v_array<char> *p_Var13;
  label_t lVar14;
  wclass *pwVar15;
  size_t sVar16;
  v_array<char> vVar17;
  byte bVar18;
  bool bVar19;
  uint i_5;
  uint64_t uVar20;
  polylabel *ppVar21;
  ulong uVar22;
  ostream *poVar23;
  v_array<char> *pvVar24;
  long lVar25;
  uint i;
  ulong uVar26;
  long lVar27;
  features *pfVar28;
  features *pfVar29;
  uint i_1;
  vw *all;
  polyprediction *ppVar30;
  uint uVar31;
  byte bVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  example *peVar36;
  example *peVar37;
  example *ec_00;
  undefined4 in_stack_fffffffffffffc68;
  float fVar38;
  polyprediction *ppVar39;
  float local_388;
  float local_384;
  float local_380;
  string local_310 [32];
  ostringstream outputStringStream;
  shared_data sd;
  features save_nn_output_namespace;
  
  bVar32 = 0;
  all = n->all;
  iVar5 = all->raw_prediction;
  if (n->finished_setup == false) {
    finish_setup(n,all);
    all = n->all;
  }
  memcpy(&sd,all->sd,0xe0);
  psVar7 = all->sd;
  all->sd = &sd;
  if (n->dropout == false) {
    fVar33 = 1.0;
  }
  else {
    fVar33 = 2.0;
  }
  fVar4 = (ec->l).simple.label;
  p_Var8 = n->all->set_minmax;
  plVar9 = n->all->loss;
  pbVar10 = n->dropped_out;
  pred = n->hidden_units_pred;
  ppVar30 = n->hiddenbias_pred;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&outputStringStream);
  n->all->set_minmax = noop_mm;
  n->all->loss = n->squared_loss;
  psVar11 = n->all->sd;
  fVar38 = psVar11->min_label;
  psVar11->min_label = -3.0;
  psVar11 = n->all->sd;
  fVar35 = psVar11->max_label;
  psVar11->max_label = 3.0;
  uVar12 = (ec->super_example_predict).ft_offset;
  uVar20 = uVar12;
  if (n->multitask == true) {
    (ec->super_example_predict).ft_offset = 0;
    uVar20 = 0;
  }
  (n->hiddenbias).super_example_predict.ft_offset = uVar20;
  LEARNER::learner<char,_example>::multipredict(base,&n->hiddenbias,0,(ulong)n->k,ppVar30,true);
  ppVar21 = &ec->l;
  peVar36 = ec;
  ppVar39 = ppVar30;
  for (uVar26 = 0; uVar26 < n->k; uVar26 = uVar26 + 1) {
    if ((ppVar30->scalar == 0.0) && (!NAN(ppVar30->scalar))) {
      fVar34 = merand48(&n->all->random_state);
      (n->hiddenbias).l.simple.label = fVar34 + -0.5;
      LEARNER::learner<char,_example>::learn(base,&n->hiddenbias,uVar26);
      (n->hiddenbias).l.multi.label = 0x7f7fffff;
    }
    ppVar30 = ppVar30 + 1;
  }
  uVar31 = 1;
  LEARNER::learner<char,_example>::multipredict(base,peVar36,0,(ulong)n->k,pred,true);
  for (uVar26 = 0; uVar22 = (ulong)n->k, uVar26 < uVar22; uVar26 = uVar26 + 1) {
    if (n->dropout == true) {
      fVar34 = merand48(&n->xsubi);
      bVar19 = fVar34 < 0.5;
    }
    else {
      bVar19 = false;
    }
    pbVar10[uVar26] = bVar19;
  }
  ec_00 = peVar36;
  if (peVar36->passthrough != (features *)0x0) {
    lVar27 = 0;
    for (uVar26 = 0; uVar26 < uVar22; uVar26 = uVar26 + 1) {
      add_passthrough_feature_magic
                (peVar36,0x398d4541,(ulong)(uVar31 - 1),*(float *)((long)ppVar39 + lVar27));
      add_passthrough_feature_magic
                (peVar36,0x398d4541,(ulong)uVar31,*(float *)((long)pred + lVar27));
      uVar22 = (ulong)n->k;
      uVar31 = uVar31 + 2;
      lVar27 = lVar27 + 0x20;
    }
  }
  if (0 < iVar5) {
    ppVar30 = pred;
    for (uVar26 = 0; uVar26 < uVar22; uVar26 = uVar26 + 1) {
      if (uVar26 != 0) {
        std::operator<<((ostream *)&outputStringStream,' ');
      }
      poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)&outputStringStream);
      poVar23 = std::operator<<(poVar23,':');
      poVar23 = (ostream *)std::ostream::operator<<(poVar23,ppVar30->scalar);
      poVar23 = std::operator<<(poVar23,',');
      fVar34 = fasttanh(ppVar30->scalar);
      std::ostream::operator<<(poVar23,fVar34);
      uVar22 = (ulong)n->k;
      ppVar30 = ppVar30 + 1;
    }
  }
  n->all->loss = plVar9;
  n->all->set_minmax = p_Var8;
  n->all->sd->min_label = fVar38;
  n->all->sd->max_label = fVar35;
  (ec_00->super_example_predict).ft_offset = uVar12;
  peVar36 = &n->outputweight;
  ppVar2 = &(n->output_layer).l;
  pfVar3 = (ec_00->super_example_predict).feature_space + 0x81;
  pvVar24 = &ec_00->tag;
  bVar18 = 1;
  local_384 = 0.0;
  local_380 = 0.0;
  local_388 = 0.0;
  while( true ) {
    (n->output_layer).total_sum_feat_sq = 1.0;
    (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq = 1.0;
    (n->outputweight).super_example_predict.ft_offset = (ec_00->super_example_predict).ft_offset;
    n->all->set_minmax = noop_mm;
    n->all->loss = n->squared_loss;
    psVar11 = n->all->sd;
    fVar38 = psVar11->min_label;
    psVar11->min_label = -1.0;
    psVar11 = n->all->sd;
    fVar35 = psVar11->max_label;
    psVar11->max_label = 1.0;
    ppVar30 = pred;
    for (uVar26 = 0; uVar26 < n->k; uVar26 = uVar26 + 1) {
      fVar34 = 0.0;
      if (pbVar10[uVar26] == false) {
        fVar34 = fasttanh(ppVar30->scalar);
        fVar34 = fVar34 * fVar33;
      }
      (n->output_layer).super_example_predict.feature_space[0x81].values._begin[uVar26] = fVar34;
      (n->output_layer).total_sum_feat_sq = (n->output_layer).total_sum_feat_sq + fVar34 * fVar34;
      (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq =
           fVar34 * fVar34 + (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq
      ;
      *(n->outputweight).super_example_predict.feature_space[0x81].indicies._begin =
           (n->output_layer).super_example_predict.feature_space[0x81].indicies._begin[uVar26];
      LEARNER::learner<char,_example>::predict(base,peVar36,(ulong)n->k);
      fVar34 = (n->outputweight).pred.scalar;
      if ((fVar34 == 0.0) && (!NAN(fVar34))) {
        uVar31 = n->k;
        fVar34 = merand48(&n->all->random_state);
        (n->outputweight).l.simple.label = (fVar34 + -0.5) / SQRT((float)uVar31);
        LEARNER::learner<char,_example>::update(base,peVar36,(ulong)n->k);
        (n->outputweight).l.multi.label = 0x7f7fffff;
      }
      ppVar30 = ppVar30 + 1;
    }
    n->all->loss = plVar9;
    n->all->set_minmax = p_Var8;
    n->all->sd->min_label = fVar38;
    n->all->sd->max_label = fVar35;
    if (n->inpass == false) {
      (n->output_layer).super_example_predict.ft_offset = (ec_00->super_example_predict).ft_offset;
      (n->output_layer).l.cb_eval.event.costs.erase_count = (ec->l).cb_eval.event.costs.erase_count;
      lVar14 = ppVar21->multi;
      pwVar15 = (ec->l).cs.costs._end;
      sVar16 = (ec->l).cs.costs.erase_count;
      (n->output_layer).l.cs.costs.end_array = (ec->l).cs.costs.end_array;
      (n->output_layer).l.cs.costs.erase_count = sVar16;
      ppVar2->multi = lVar14;
      (n->output_layer).l.cs.costs._end = pwVar15;
      (n->output_layer).weight = ec_00->weight;
      (n->output_layer).partial_prediction = 0.0;
      LEARNER::learner<char,_example>::predict(base,&n->output_layer,(ulong)n->k);
      (ec->l).cb_eval.event.costs.erase_count = (n->output_layer).l.cb_eval.event.costs.erase_count;
      lVar14 = ppVar2->multi;
      pwVar15 = (n->output_layer).l.cs.costs._end;
      sVar16 = (n->output_layer).l.cs.costs.erase_count;
      (ec->l).cs.costs.end_array = (n->output_layer).l.cs.costs.end_array;
      (ec->l).cs.costs.erase_count = sVar16;
      ppVar21->multi = lVar14;
      (ec->l).cs.costs._end = pwVar15;
    }
    else {
      v_array<unsigned_char>::push_back((v_array<unsigned_char> *)ec_00,&nn_output_namespace);
      pfVar28 = pfVar3;
      pfVar29 = &save_nn_output_namespace;
      for (lVar27 = 0xd; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pfVar29->values)._begin = (pfVar28->values)._begin;
        pfVar28 = (features *)((long)pfVar28 + (ulong)bVar32 * -0x10 + 8);
        pfVar29 = (features *)((long)pfVar29 + (ulong)bVar32 * -0x10 + 8);
      }
      lVar27 = 100;
      pfVar28 = (n->output_layer).super_example_predict.feature_space + 0x81;
      pfVar29 = pfVar3;
      for (lVar25 = lVar27; lVar25 != 0; lVar25 = lVar25 + -1) {
        *(undefined1 *)&(pfVar29->values)._begin = *(undefined1 *)&(pfVar28->values)._begin;
        pfVar28 = (features *)((long)pfVar28 + (ulong)bVar32 * -2 + 1);
        pfVar29 = (features *)((long)pfVar29 + (ulong)bVar32 * -2 + 1);
      }
      ec_00->total_sum_feat_sq =
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq +
           ec_00->total_sum_feat_sq;
      peVar37 = ec_00;
      LEARNER::learner<char,_example>::predict(base,ec_00,(ulong)n->k);
      (n->output_layer).partial_prediction = ec_00->partial_prediction;
      (n->output_layer).loss = ec_00->loss;
      ec_00->total_sum_feat_sq =
           ec_00->total_sum_feat_sq -
           (n->output_layer).super_example_predict.feature_space[0x81].sum_feat_sq;
      pfVar28 = &save_nn_output_namespace;
      pfVar29 = pfVar3;
      for (; lVar27 != 0; lVar27 = lVar27 + -1) {
        *(undefined1 *)&(pfVar29->values)._begin = *(undefined1 *)&(pfVar28->values)._begin;
        pfVar28 = (features *)((long)pfVar28 + (ulong)bVar32 * -2 + 1);
        pfVar29 = (features *)((long)pfVar29 + (ulong)bVar32 * -2 + 1);
      }
      ppuVar1 = &(ec_00->super_example_predict).indices._end;
      *ppuVar1 = *ppuVar1 + -1;
      ec_00 = peVar37;
    }
    fVar35 = GD::finalize_prediction(n->all->sd,(n->output_layer).partial_prediction);
    n->prediction = fVar35;
    if (0 < iVar5) {
      poVar23 = std::operator<<((ostream *)&outputStringStream,' ');
      std::ostream::operator<<(poVar23,(n->output_layer).partial_prediction);
      p_Var13 = n->all->print_text;
      iVar6 = n->all->raw_prediction;
      std::__cxx11::stringbuf::str();
      vVar17._end = (char *)base;
      vVar17._begin = (char *)ec_00;
      vVar17.end_array._0_4_ = in_stack_fffffffffffffc68;
      vVar17.end_array._4_4_ = fVar38;
      vVar17.erase_count = (size_t)peVar36;
      (*p_Var13)(iVar6,(string)*pvVar24,vVar17);
      std::__cxx11::string::~string(local_310);
    }
    (ppVar21->simple).label = fVar4;
    if (bVar18 != 0) {
      local_380 = n->prediction;
      local_384 = (n->output_layer).partial_prediction;
      local_388 = (n->output_layer).loss;
    }
    if ((bVar18 & n->dropout) != 1) break;
    for (uVar26 = 0; uVar26 < n->k; uVar26 = uVar26 + 1) {
      pbVar10[uVar26] = (bool)(pbVar10[uVar26] ^ 1);
    }
    bVar18 = 0;
  }
  ec_00->partial_prediction = local_384;
  (ec_00->pred).scalar = local_380;
  ec_00->loss = local_388;
  n->all->sd = psVar7;
  (*n->all->set_minmax)(n->all->sd,sd.min_label);
  (*n->all->set_minmax)(n->all->sd,sd.max_label);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&outputStringStream);
  return;
}

Assistant:

void predict_or_learn_multi(nn& n, single_learner& base, example& ec)
{
  bool shouldOutput = n.all->raw_prediction > 0;
  if (!n.finished_setup)
    finish_setup(n, *(n.all));
  shared_data sd;
  memcpy(&sd, n.all->sd, sizeof(shared_data));
  shared_data* save_sd = n.all->sd;
  n.all->sd = &sd;

  label_data ld = ec.l.simple;
  void (*save_set_minmax)(shared_data*, float) = n.all->set_minmax;
  float save_min_label;
  float save_max_label;
  float dropscale = n.dropout ? 2.0f : 1.0f;
  loss_function* save_loss = n.all->loss;

  polyprediction* hidden_units = n.hidden_units_pred;
  polyprediction* hiddenbias_pred = n.hiddenbias_pred;
  bool* dropped_out = n.dropped_out;

  ostringstream outputStringStream;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = hidden_min_activation;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = hidden_max_activation;

  uint64_t save_ft_offset = ec.ft_offset;

  if (n.multitask)
    ec.ft_offset = 0;

  n.hiddenbias.ft_offset = ec.ft_offset;

  if (recompute_hidden)
  {
    base.multipredict(n.hiddenbias, 0, n.k, hiddenbias_pred, true);

    for (unsigned int i = 0; i < n.k; ++i)
      // avoid saddle point at 0
      if (hiddenbias_pred[i].scalar == 0)
      {
        n.hiddenbias.l.simple.label = (float)(merand48(n.all->random_state) - 0.5);
        base.learn(n.hiddenbias, i);
        n.hiddenbias.l.simple.label = FLT_MAX;
      }

    base.multipredict(ec, 0, n.k, hidden_units, true);

    for (unsigned int i = 0; i < n.k; ++i) dropped_out[i] = (n.dropout && merand48(n.xsubi) < 0.5);

    if (ec.passthrough)
      for (unsigned int i = 0; i < n.k; ++i)
      {
        add_passthrough_feature(ec, i * 2, hiddenbias_pred[i].scalar);
        add_passthrough_feature(ec, i * 2 + 1, hidden_units[i].scalar);
      }
  }

  if (shouldOutput)
    for (unsigned int i = 0; i < n.k; ++i)
    {
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << i << ':' << hidden_units[i].scalar << ','
                         << fasttanh(hidden_units[i].scalar);  // TODO: huh, what was going on here?
    }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;
  ec.ft_offset = save_ft_offset;

  bool converse = false;
  float save_partial_prediction = 0;
  float save_final_prediction = 0;
  float save_ec_loss = 0;

CONVERSE:  // That's right, I'm using goto.  So sue me.

  n.output_layer.total_sum_feat_sq = 1;
  n.output_layer.feature_space[nn_output_namespace].sum_feat_sq = 1;

  n.outputweight.ft_offset = ec.ft_offset;

  n.all->set_minmax = noop_mm;
  n.all->loss = n.squared_loss;
  save_min_label = n.all->sd->min_label;
  n.all->sd->min_label = -1;
  save_max_label = n.all->sd->max_label;
  n.all->sd->max_label = 1;

  for (unsigned int i = 0; i < n.k; ++i)
  {
    float sigmah = (dropped_out[i]) ? 0.0f : dropscale * fasttanh(hidden_units[i].scalar);
    features& out_fs = n.output_layer.feature_space[nn_output_namespace];
    out_fs.values[i] = sigmah;

    n.output_layer.total_sum_feat_sq += sigmah * sigmah;
    out_fs.sum_feat_sq += sigmah * sigmah;

    n.outputweight.feature_space[nn_output_namespace].indicies[0] = out_fs.indicies[i];
    base.predict(n.outputweight, n.k);
    float wf = n.outputweight.pred.scalar;

    // avoid saddle point at 0
    if (wf == 0)
    {
      float sqrtk = sqrt((float)n.k);
      n.outputweight.l.simple.label = (float)(merand48(n.all->random_state) - 0.5) / sqrtk;
      base.update(n.outputweight, n.k);
      n.outputweight.l.simple.label = FLT_MAX;
    }
  }

  n.all->loss = save_loss;
  n.all->set_minmax = save_set_minmax;
  n.all->sd->min_label = save_min_label;
  n.all->sd->max_label = save_max_label;

  if (n.inpass)
  {
    // TODO: this is not correct if there is something in the
    // nn_output_namespace but at least it will not leak memory
    // in that case
    ec.indices.push_back(nn_output_namespace);
    features save_nn_output_namespace = ec.feature_space[nn_output_namespace];
    ec.feature_space[nn_output_namespace] = n.output_layer.feature_space[nn_output_namespace];
    ec.total_sum_feat_sq += n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    if (is_learn)
      base.learn(ec, n.k);
    else
      base.predict(ec, n.k);
    n.output_layer.partial_prediction = ec.partial_prediction;
    n.output_layer.loss = ec.loss;
    ec.total_sum_feat_sq -= n.output_layer.feature_space[nn_output_namespace].sum_feat_sq;
    ec.feature_space[nn_output_namespace].sum_feat_sq = 0;
    ec.feature_space[nn_output_namespace] = save_nn_output_namespace;
    ec.indices.pop();
  }
  else
  {
    n.output_layer.ft_offset = ec.ft_offset;
    n.output_layer.l = ec.l;
    n.output_layer.weight = ec.weight;
    n.output_layer.partial_prediction = 0;
    if (is_learn)
      base.learn(n.output_layer, n.k);
    else
      base.predict(n.output_layer, n.k);
    ec.l = n.output_layer.l;
  }

  n.prediction = GD::finalize_prediction(n.all->sd, n.output_layer.partial_prediction);

  if (shouldOutput)
  {
    outputStringStream << ' ' << n.output_layer.partial_prediction;
    n.all->print_text(n.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (is_learn && n.all->training && ld.label != FLT_MAX)
  {
    float gradient = n.all->loss->first_derivative(n.all->sd, n.prediction, ld.label);

    if (fabs(gradient) > 0)
    {
      n.all->loss = n.squared_loss;
      n.all->set_minmax = noop_mm;
      save_min_label = n.all->sd->min_label;
      n.all->sd->min_label = hidden_min_activation;
      save_max_label = n.all->sd->max_label;
      n.all->sd->max_label = hidden_max_activation;
      save_ft_offset = ec.ft_offset;

      if (n.multitask)
        ec.ft_offset = 0;

      for (unsigned int i = 0; i < n.k; ++i)
      {
        if (!dropped_out[i])
        {
          float sigmah = n.output_layer.feature_space[nn_output_namespace].values[i] / dropscale;
          float sigmahprime = dropscale * (1.0f - sigmah * sigmah);
          n.outputweight.feature_space[nn_output_namespace].indicies[0] =
              n.output_layer.feature_space[nn_output_namespace].indicies[i];
          base.predict(n.outputweight, n.k);
          float nu = n.outputweight.pred.scalar;
          float gradhw = 0.5f * nu * gradient * sigmahprime;

          ec.l.simple.label = GD::finalize_prediction(n.all->sd, hidden_units[i].scalar - gradhw);
          ec.pred.scalar = hidden_units[i].scalar;
          if (ec.l.simple.label != hidden_units[i].scalar)
            base.update(ec, i);
        }
      }

      n.all->loss = save_loss;
      n.all->set_minmax = save_set_minmax;
      n.all->sd->min_label = save_min_label;
      n.all->sd->max_label = save_max_label;
      ec.ft_offset = save_ft_offset;
    }
  }

  ec.l.simple.label = ld.label;

  if (!converse)
  {
    save_partial_prediction = n.output_layer.partial_prediction;
    save_final_prediction = n.prediction;
    save_ec_loss = n.output_layer.loss;
  }

  if (n.dropout && !converse)
  {
    for (unsigned int i = 0; i < n.k; ++i)
    {
      dropped_out[i] = !dropped_out[i];
    }

    converse = true;
    goto CONVERSE;
  }

  ec.partial_prediction = save_partial_prediction;
  ec.pred.scalar = save_final_prediction;
  ec.loss = save_ec_loss;

  n.all->sd = save_sd;
  n.all->set_minmax(n.all->sd, sd.min_label);
  n.all->set_minmax(n.all->sd, sd.max_label);
}